

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O1

void __thiscall
Eigen::TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  long lVar1;
  ulong nbRows;
  ulong nbCols;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  nbRows = *(ulong *)(*(long *)this + 8);
  nbCols = *(ulong *)(*(long *)this + 0x10);
  if ((long)(nbCols | nbRows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((nbCols != 0 && nbRows != 0) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816((long)nbCols),0) < (long)nbRows)) {
    puVar8 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar6 % SEXT816((long)nbCols),0));
    *puVar8 = operator_delete;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)other,nbCols * nbRows,nbRows,nbCols);
  lVar2 = *(long *)(other + 0x10);
  if (0 < lVar2) {
    lVar3 = *(long *)other;
    lVar4 = *(long *)(other + 8);
    lVar10 = **(long **)this;
    lVar5 = (*(long **)this)[1];
    lVar11 = 0;
    lVar12 = lVar3;
    do {
      lVar9 = lVar11;
      if (lVar4 < lVar11) {
        lVar9 = lVar4;
      }
      if (lVar11 < lVar4) {
        lVar7 = 0;
        do {
          *(undefined8 *)(lVar12 + lVar7 * 8) = *(undefined8 *)(lVar10 + lVar7 * 8);
          lVar1 = lVar11 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar1 + 1 < lVar4);
      }
      if (0 < lVar9) {
        memset((void *)(lVar4 * 8 * lVar11 + lVar3),0,lVar9 << 3);
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + lVar4 * 8 + 8;
      lVar10 = lVar10 + lVar5 * 8 + 8;
    } while (lVar11 != lVar2);
  }
  return;
}

Assistant:

inline Index rows() const { return m_matrix.rows(); }